

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall IMLE<1,_1,_FastLinearExpert>::update(IMLE<1,_1,_FastLinearExpert> *this,Z *z,X *x)

{
  int iVar1;
  pointer this_00;
  Scal SVar2;
  double dVar3;
  FastLinearExpert<1,_1> local_1d0;
  
  this_00 = (this->experts).
            super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
            .
            super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  dVar3 = 0.0;
  if (this_00 < (this->experts).
                super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                .
                super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      SVar2 = LinearExpert<1,_1>::queryZXandH(&this_00->super_LinearExpert<1,_1>,z,x);
      dVar3 = dVar3 + SVar2;
      this_00 = this_00 + 1;
    } while (this_00 < (this->experts).
                       super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                       .
                       super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((this->M == 0) || (dVar3 < this->pNoiseModelZX / (double)this->M)) {
    if (0 < this->noise_to_go) {
      iVar1 = this->noise_to_go + -1;
      goto LAB_00143016;
    }
    FastLinearExpert<1,_1>::FastLinearExpert(&local_1d0,z,x,this);
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    push_back(&(this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ,&local_1d0);
    LinearExpert<1,_1>::queryH
              (&(this->experts).
                super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                .
                super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].super_LinearExpert<1,_1>,z,x);
    this->M = (int)((ulong)((long)(this->experts).
                                  super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                  .
                                  super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->experts).
                                 super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                 .
                                 super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x73ecade3;
  }
  EM(this,z,x);
  iVar1 = (this->param).nOutliers;
LAB_00143016:
  this->noise_to_go = iVar1;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::update(Z const &z, X const &x)
{
#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d || x.size() != D)
    {
        message("IMLE::update: sample point dimensions do not match!!");
        return;
    }
#endif

    // Query experts
    Scal sum_zx = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_zx += it->queryZXandH(z,x);

    // Create new expert?
    if( sum_zx < pNoiseModelZX / M || M == 0 )
	{
	    if( noise_to_go > 0)
	    {
	        noise_to_go--;
            return;
	    }

        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().queryH(z,x);
        M = experts.size();
	}

    EM(z,x);

	noise_to_go = param.nOutliers;
}